

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O0

void setLLSMethod(reg_object obj,char *llsmethod)

{
  int iVar1;
  char *llsmethod_local;
  reg_object obj_local;
  
  iVar1 = strcmp(llsmethod,"qr");
  if (iVar1 == 0) {
    strcpy(obj->lls,llsmethod);
  }
  else {
    iVar1 = strcmp(llsmethod,"normal");
    if (iVar1 == 0) {
      strcpy(obj->lls,llsmethod);
      printf(
            "Warning - This method will not calculate the rank of the regression. Use method qr instead. \n"
            );
    }
    else {
      iVar1 = strcmp(llsmethod,"svd");
      if (iVar1 != 0) {
        printf("This function only accepts one of three least square methods - \n");
        printf(" qr, normal and svd. \n");
        exit(-1);
      }
      strcpy(obj->lls,llsmethod);
      printf(
            "Warning - This method will not calculate the rank of the regression. use method qr instead. \n"
            );
    }
  }
  return;
}

Assistant:

void setLLSMethod(reg_object obj, char *llsmethod) {
	if (!strcmp(llsmethod, "qr")) {
		strcpy(obj->lls, llsmethod);
	}
	else if (!strcmp(llsmethod, "normal")) {
		strcpy(obj->lls, llsmethod);
		printf("Warning - This method will not calculate the rank of the regression. Use method qr instead. \n");
	}
	else if (!strcmp(llsmethod, "svd")) {
		strcpy(obj->lls, llsmethod);
		printf("Warning - This method will not calculate the rank of the regression. use method qr instead. \n");
	}
	else {
		printf("This function only accepts one of three least square methods - \n");
		printf(" qr, normal and svd. \n");
		exit(-1);
	}
}